

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O3

vector<duckdb::PrimitiveType<double>,_true> *
duckdb::EquiWidthBinsDouble::Operation
          (vector<duckdb::PrimitiveType<double>,_true> *__return_storage_ptr__,Expression *expr,
          double min,double input_max,idx_t bin_count,bool nice_rounding)

{
  iterator __position;
  undefined1 auVar1 [16];
  bool bVar2;
  reference pvVar3;
  InvalidInputException *this;
  InternalException *this_00;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  pointer local_90;
  pointer local_88;
  double local_68;
  string local_48;
  
  bVar2 = Value::IsFinite<double>(min);
  if ((!bVar2) || (bVar2 = Value::IsFinite<double>(input_max), !bVar2)) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "equi_width_bucket does not support infinite or nan as min/max value","");
    InvalidInputException::InvalidInputException(this,&local_48);
    __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>).
  super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>).
  super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>).
  super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = Value::IsFinite<double>(input_max - min);
  auVar6._8_4_ = (int)(bin_count >> 0x20);
  auVar6._0_8_ = bin_count;
  auVar6._12_4_ = 0x45300000;
  local_68 = (auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)bin_count) - 4503599627370496.0);
  if (bVar2) {
    local_68 = (input_max - min) / local_68;
  }
  else {
    auVar5._8_8_ = min;
    auVar5._0_8_ = input_max;
    auVar1._8_8_ = local_68;
    auVar1._0_8_ = local_68;
    auVar6 = divpd(auVar5,auVar1);
    local_68 = auVar6._0_8_ - auVar6._8_8_;
  }
  dVar7 = 1.0;
  if (1.0 <= local_68) {
    if (1.0 < local_68) {
      dVar7 = 1.0;
      do {
        dVar7 = dVar7 * 10.0;
      } while (dVar7 < local_68);
    }
    dVar7 = dVar7 / 10.0;
  }
  else {
    dVar7 = 1.0;
    do {
      dVar7 = dVar7 / 10.0;
    } while (local_68 < dVar7);
  }
  local_88 = (pointer)input_max;
  if (nice_rounding) {
    local_68 = MakeNumberNice(local_68,local_68,ROUND);
    dVar4 = ceil(input_max / local_68);
    bVar2 = Value::IsFinite<double>(dVar4 * local_68);
    local_88 = (pointer)(dVar4 * local_68);
    if (!bVar2) {
      local_88 = (pointer)input_max;
    }
    bin_count = bin_count * 2;
  }
  if ((local_68 == 0.0) && (!NAN(local_68))) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"step is 0!?","");
    InternalException::InternalException(this_00,&local_48);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (min < (double)local_88) {
    do {
      local_90 = local_88;
      if (nice_rounding) {
        dVar4 = round((10.0 / dVar7) * (double)local_88);
        local_90 = (pointer)(dVar4 / (10.0 / dVar7));
      }
      if ((__return_storage_ptr__->
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ).
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ).
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00f8f816:
        if ((double)local_90 <= min) {
          return __return_storage_ptr__;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
             ).
             super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (bin_count <=
            (ulong)((long)__position._M_current -
                    (long)(__return_storage_ptr__->
                          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                          ).
                          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          return __return_storage_ptr__;
        }
        local_48._M_dataplus._M_p = local_90;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
            ).
            super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
          ::_M_realloc_insert<duckdb::PrimitiveType<double>>
                    ((vector<duckdb::PrimitiveType<double>,std::allocator<duckdb::PrimitiveType<double>>>
                      *)__return_storage_ptr__,__position,(PrimitiveType<double> *)&local_48);
        }
        else {
          (__position._M_current)->val = (double)local_90;
          (__return_storage_ptr__->
          super_vector<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ).
          super__Vector_base<duckdb::PrimitiveType<double>,_std::allocator<duckdb::PrimitiveType<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else {
        pvVar3 = vector<duckdb::PrimitiveType<double>,_true>::back(__return_storage_ptr__);
        if ((pvVar3->val != (double)local_90) || (NAN(pvVar3->val) || NAN((double)local_90)))
        goto LAB_00f8f816;
      }
      local_88 = (pointer)((double)local_88 - local_68);
    } while (min < (double)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<PrimitiveType<double>> Operation(const Expression &expr, double min, double input_max,
	                                               idx_t bin_count, bool nice_rounding) {
		double max = input_max;
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			throw InvalidInputException("equi_width_bucket does not support infinite or nan as min/max value");
		}
		vector<PrimitiveType<double>> result;
		const double span = max - min;
		double step;
		if (!Value::IsFinite(span)) {
			// max - min does not fit
			step = max / static_cast<double>(bin_count) - min / static_cast<double>(bin_count);
		} else {
			step = span / static_cast<double>(bin_count);
		}
		const double step_power_of_ten = GetPreviousPowerOfTen(step);
		if (nice_rounding) {
			// when doing nice rounding we try to make the max/step values nicer
			step = MakeNumberNice(step, step, NiceRounding::ROUND);
			max = RoundToNumber(input_max, step, NiceRounding::CEILING);
			// we allow for more bins when doing nice rounding since the bin count is approximate
			bin_count *= 2;
		}
		if (step == 0) {
			throw InternalException("step is 0!?");
		}

		const double round_multiplication = 10 / step_power_of_ten;
		for (double bin_boundary = max; bin_boundary > min; bin_boundary -= step) {
			// because floating point addition adds inaccuracies, we add rounding at every step
			double real_boundary = bin_boundary;
			if (nice_rounding) {
				real_boundary = std::round(bin_boundary * round_multiplication) / round_multiplication;
			}
			if (!result.empty() && result.back().val == real_boundary) {
				// skip this step
				continue;
			}
			if (real_boundary <= min || result.size() >= bin_count) {
				// we can never generate below input_min
				break;
			}
			result.push_back(real_boundary);
		}
		return result;
	}